

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O1

void __thiscall SAT::topLevelCleanUp(SAT *this)

{
  vec<Clause_*> *pvVar1;
  ostream *poVar2;
  vec<Lit> *pvVar3;
  long lVar4;
  ulong uVar5;
  string local_50;
  
  lVar4 = (long)(int)((this->rtrail).data)->sz;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    do {
      free(((this->rtrail).data)->data[lVar4 + -2]);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  pvVar1 = (this->rtrail).data;
  if (pvVar1->data != (Clause **)0x0) {
    pvVar1->sz = 0;
  }
  if ((so.sat_simplify != false) && (this->next_simp_db <= this->propagations)) {
    simplifyDB(this);
  }
  pvVar3 = (this->trail).data;
  if (pvVar3->sz != 0) {
    uVar5 = 0;
    do {
      if (so.debug == true) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"setting true at top-level: ",0x1b);
        getLitString_abi_cxx11_(&local_50,((this->trail).data)->data[uVar5].x);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_50._M_dataplus._M_p,
                            local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
      (this->seen).data[(uint)(((this->trail).data)->data[uVar5].x >> 1)] = '\x01';
      (this->trailpos).data[(uint)(((this->trail).data)->data[uVar5].x >> 1)] = -1;
      uVar5 = uVar5 + 1;
      pvVar3 = (this->trail).data;
    } while (uVar5 < pvVar3->sz);
  }
  if (pvVar3->data != (Lit *)0x0) {
    pvVar3->sz = 0;
  }
  *(this->qhead).data = 0;
  return;
}

Assistant:

void SAT::topLevelCleanUp() {
	assert(decisionLevel() == 0);

	for (int i = rtrail[0].size(); i-- > 0;) {
		free(rtrail[0][i]);
	}
	rtrail[0].clear();

	if (so.sat_simplify && propagations >= next_simp_db) {
		simplifyDB();
	}

	for (unsigned int i = 0; i < trail[0].size(); i++) {
		if (so.debug) {
			std::cerr << "setting true at top-level: " << getLitString(toInt(trail[0][i])) << "\n";
		}
		seen[var(trail[0][i])] = 1;
		trailpos[var(trail[0][i])] = -1;
	}
	trail[0].clear();
	qhead[0] = 0;
}